

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O1

void m2v_copy_col(m2v *M1,int c1,m2v *Mt,int ct)

{
  uint uVar1;
  m2v_base *pmVar2;
  m2v_base *pmVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  
  uVar7 = 1 << ((byte)ct & 0x1f);
  if (0 < M1->n_row) {
    pmVar2 = M1->e;
    iVar8 = c1 + 0x1f;
    if (-1 < c1) {
      iVar8 = c1;
    }
    pmVar3 = Mt->e;
    iVar9 = ct + 0x1f;
    if (-1 < ct) {
      iVar9 = ct;
    }
    iVar4 = 0;
    do {
      iVar5 = Mt->row_stride * iVar4 + (iVar9 >> 5);
      uVar1 = pmVar3[iVar5];
      uVar6 = uVar1 | uVar7;
      if ((pmVar2[M1->row_stride * iVar4 + (iVar8 >> 5)] & 1 << ((byte)c1 & 0x1f)) == 0) {
        uVar6 = uVar1 & ~uVar7;
      }
      pmVar3[iVar5] = uVar6;
      iVar4 = iVar4 + 1;
    } while (iVar4 < M1->n_row);
  }
  return;
}

Assistant:

void m2v_copy_col(const m2v* M1,
			int c1,
			m2v* Mt,
			int ct)
{
	assert(M1->n_row == Mt->n_row);
	assert(0 <= c1 && c1 < M1->n_col);
	assert(0 <= ct && ct < Mt->n_col);

	const m2v_base m1 = get_mask(get_bit(M1, c1));
	const m2v_base mt = get_mask(get_bit(Mt, ct));
	for (int i = 0; i < M1->n_row; ++i) {
		const m2v_base w1 = M1->e[get_word(M1, i, c1)];
		m2v_base* p = &Mt->e[get_word(Mt, i, ct)];
		if (w1 & m1) {
			*p |= mt;
		} else {
			*p &= ~mt;
		}
	}
}